

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

void NEXTH(int *BOOL,int NN,double *QHR,double *QHI,double *QPR,double *QPI,double *TR,double *TI,
          double *HR,double *HI)

{
  double dVar1;
  long lVar2;
  double dVar3;
  
  if ((int)BOOL == 0) {
    if (2 < NN) {
      lVar2 = 0;
      do {
        dVar3 = *(double *)((long)QHR + lVar2);
        dVar1 = *(double *)((long)QHI + lVar2);
        *(double *)((long)HR + lVar2 + 8) =
             (*TR * dVar3 - *TI * dVar1) + *(double *)((long)QPR + lVar2 + 8);
        *(double *)((long)HI + lVar2 + 8) =
             dVar1 * *TR + dVar3 * *TI + *(double *)((long)QPI + lVar2 + 8);
        lVar2 = lVar2 + 8;
      } while ((ulong)(NN - 1U) * 8 + -8 != lVar2);
    }
    *HR = *QPR;
    dVar3 = *QPI;
  }
  else {
    if (2 < NN) {
      lVar2 = 0;
      do {
        HR[lVar2 + 1] = QHR[lVar2];
        HI[lVar2 + 1] = QHI[lVar2];
        lVar2 = lVar2 + 1;
      } while ((ulong)(NN - 1U) - 1 != lVar2);
    }
    *HR = 0.0;
    dVar3 = 0.0;
  }
  *HI = dVar3;
  return;
}

Assistant:

static void NEXTH(int *BOOL, int NN, double *QHR, double *QHI, double *QPR, double *QPI, double *TR, double *TI,double *HR, double *HI) {
	/*
	C CALCULATES THE NEXT SHIFTED H POLYNOMIAL.
	C BOOL   -  INT , IF 1 H(S) IS ESSENTIALLY ZERO
	*/

	double T1, T2;
	int N, NM1,j;
	N = NN - 1;
	NM1 = N - 1;

	if (*BOOL == 0) {
		for (j = 1; j < N; ++j) {
			T1 = QHR[j - 1];
			T2 = QHI[j - 1];
			HR[j] = *TR*T1 - *TI*T2 + QPR[j];
			HI[j] = *TR*T2 + *TI*T1 + QPI[j];
		}
		HR[0] = QPR[0];
		HI[0] = QPI[0];
	}
	else {
		for (j = 1; j < N; ++j) {
			HR[j] = QHR[j - 1];
			HI[j] = QHI[j - 1];
		}
		HR[0] = 0.0;
		HI[0] = 0.0;
	}
}